

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O2

void __thiscall
crnlib::
hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
::move_into(hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
            *this,node *pNode)

{
  raw_node *prVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  raw_node *pDst;
  uint uVar5;
  
  uVar2 = hash_key(this,(block *)pNode);
  prVar1 = (this->m_values).m_p;
  pDst = prVar1 + uVar2;
  if (prVar1[uVar2].m_bits[0x41] != '\0') {
    uVar3 = (this->m_values).m_size - 1;
    uVar5 = uVar2;
    do {
      uVar4 = uVar5 - 1;
      if (uVar5 == 0) {
        uVar4 = uVar3;
      }
      if (uVar4 == uVar2) {
        return;
      }
      pDst = pDst + -1;
      if (uVar5 == 0) {
        pDst = prVar1 + uVar3;
      }
      uVar5 = uVar4;
    } while (pDst->m_bits[0x41] != '\0');
  }
  move_node((node *)pDst,pNode);
  this->m_num_valid = this->m_num_valid + 1;
  return;
}

Assistant:

inline void move_into(node* pNode)
        {
            int index = hash_key(pNode->first);
            node* pDst_node = &get_node(index);

            if (pDst_node->state)
            {
                const int orig_index = index;

                for (;;)
                {
                    if (!index)
                    {
                        index = m_values.size() - 1;
                        pDst_node = &get_node(index);
                    }
                    else
                    {
                        index--;
                        pDst_node--;
                    }

                    if (index == orig_index)
                    {
                        CRNLIB_ASSERT(false);
                        return;
                    }

                    if (!pDst_node->state)
                    {
                        break;
                    }
                }
            }

            move_node(pDst_node, pNode);

            m_num_valid++;
        }